

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

kp_error_t list_dir_r(char ***safes,int *nsafes,char *root)

{
  int iVar1;
  DIR *__dirp;
  dirent *pdVar2;
  ulong uVar3;
  char **ppcVar4;
  char *pcVar5;
  int *piVar6;
  long in_FS_OFFSET;
  char path [4096];
  kp_error_t local_103c;
  char local_1038 [4096];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __dirp = opendir(root);
  if (__dirp == (DIR *)0x0) {
    local_103c = 5;
    kp_warn(5,"cannot open dir %s",root);
  }
  else {
    pdVar2 = readdir(__dirp);
    if (pdVar2 == (dirent *)0x0) {
      local_103c = 0;
    }
    else {
      local_103c = 0;
      do {
        if ((pdVar2->d_name[0] != '.') && ((pdVar2->d_type == '\b' || (pdVar2->d_type == '\x04'))))
        {
          uVar3 = strlcpy(local_1038,root,0x1000);
          if ((0xfff < uVar3) ||
             ((uVar3 = strlcat(local_1038,"/",0x1000), 0xfff < uVar3 ||
              (uVar3 = strlcat(local_1038,pdVar2->d_name,0x1000), 0xfff < uVar3))))
          goto LAB_001063ed;
          if (pdVar2->d_type == '\x04') {
            local_103c = list_dir_r(safes,nsafes,local_1038);
          }
          else if (pdVar2->d_type == '\b') {
            ppcVar4 = (char **)reallocarray(*safes,(long)*nsafes + 1,8);
            *safes = ppcVar4;
            if (ppcVar4 != (char **)0x0) {
              pcVar5 = strndup(local_1038,0x1000);
              iVar1 = *nsafes;
              ppcVar4[iVar1] = pcVar5;
              if ((*safes)[iVar1] != (char *)0x0) {
                *nsafes = iVar1 + 1;
                goto LAB_001063b0;
              }
            }
LAB_001063ed:
            piVar6 = __errno_location();
            *piVar6 = 0xc;
            local_103c = 5;
            kp_warn(5,"memory error");
            break;
          }
        }
LAB_001063b0:
        pdVar2 = readdir(__dirp);
      } while (pdVar2 != (dirent *)0x0);
    }
    closedir(__dirp);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_103c;
}

Assistant:

static kp_error_t
list_dir_r(char ***safes, int *nsafes, char *root)
{
	kp_error_t ret = KP_SUCCESS;
	DIR *dirp;
	struct dirent *dirent;

	if ((dirp = opendir(root)) == NULL) {
		ret = KP_ERRNO;
		kp_warn(ret, "cannot open dir %s", root);
		return ret;
	}

	while ((dirent = readdir(dirp)) != NULL) {
		char path[PATH_MAX];
		if (dirent->d_name[0] == '.'
				|| (dirent->d_type != DT_REG
				&& dirent->d_type != DT_DIR)) {
			continue;
		}

		if (strlcpy(path, root, PATH_MAX) >= PATH_MAX) {
			errno = ENOMEM;
			ret = KP_ERRNO;
			kp_warn(ret, "memory error");
			goto out;
		}

		if (strlcat(path, "/", PATH_MAX) >= PATH_MAX) {
			errno = ENOMEM;
			ret = KP_ERRNO;
			kp_warn(ret, "memory error");
			goto out;
		}

		if (strlcat(path, dirent->d_name, PATH_MAX) >= PATH_MAX) {
			errno = ENOMEM;
			ret = KP_ERRNO;
			kp_warn(ret, "memory error");
			goto out;
		}

		switch (dirent->d_type) {
		case DT_REG:
			if ((*safes = reallocarray(*safes, *nsafes + 1, sizeof(char *)))
					== NULL) {
				errno = ENOMEM;
				ret = KP_ERRNO;
				kp_warn(ret, "memory error");
				goto out;
			}

			(*safes)[*nsafes] = strndup(path, PATH_MAX);
			if ((*safes)[*nsafes] == NULL) {
				errno = ENOMEM;
				ret = KP_ERRNO;
				kp_warn(ret, "memory error");
				goto out;
			}

			(*nsafes)++;
			break;
		case DT_DIR:
			ret = list_dir_r(safes, nsafes, path);
		}
	}

out:
	closedir(dirp);

	return ret;
}